

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

Task * __thiscall
AI::create_MoveToDestination
          (Task *__return_storage_ptr__,AI *this,float walkSpeed,Vector3 debugSphereColour,
          float acceptanceRadius,bool stopOnOverlap,bool usePathfinding,int parameterIndex)

{
  vector<float,_std::allocator<float>_> *this_00;
  pointer *ppVVar1;
  iterator iVar2;
  iterator __position;
  undefined3 in_register_00000009;
  Vector3 local_64;
  float local_58;
  float local_54;
  string local_50;
  
  local_58 = walkSpeed;
  local_54 = acceptanceRadius;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)walkSpeed,debugSphereColour._0_8_,debugSphereColour.z,&local_50,
             "moveToDestination","");
  Task::Task(__return_storage_ptr__,&local_50,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->action = MoveToDestination;
  this_00 = &(__return_storage_ptr__->parameters).values;
  iVar2._M_current =
       (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_58);
  }
  else {
    *iVar2._M_current = local_58;
    (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_64.x = 1.0;
  iVar2._M_current =
       (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(this_00,iVar2,&local_64.x);
  }
  else {
    *iVar2._M_current = 1.0;
    (__return_storage_ptr__->parameters).values.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_64.x = local_54;
  local_64.z = 1.0;
  local_64.y = 1.0;
  if ((char)this == '\0') {
    local_64.y = 0.0;
  }
  if (!stopOnOverlap) {
    local_64.z = 0.0;
  }
  __position._M_current =
       (__return_storage_ptr__->parameters).vectors.
       super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->parameters).vectors.
      super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::_M_realloc_insert<Math::Vector3>
              (&(__return_storage_ptr__->parameters).vectors,__position,&local_64);
  }
  else {
    (__position._M_current)->z = local_64.z;
    (__position._M_current)->x = local_54;
    (__position._M_current)->y = local_64.y;
    ppVVar1 = &(__return_storage_ptr__->parameters).vectors.
               super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  local_64.x = 1.4013e-45;
  local_64.y = (float)CONCAT31(in_register_00000009,usePathfinding);
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(__return_storage_ptr__->postconditions).satisfiedPredicates,
             (SatisfiablePredicateParams *)&local_64);
  return __return_storage_ptr__;
}

Assistant:

Task create_MoveToDestination(float walkSpeed, Math::Vector3 debugSphereColour, float acceptanceRadius = 1.f, bool stopOnOverlap = true, bool usePathfinding = true, int parameterIndex = -1)
	{
		/*
		Parameters:
		values: 
		0 is walk speed
		1 is NeedsMoveToCalled
		*/
		Task moveToDestination {"moveToDestination"};
		moveToDestination.action = Action::MoveToDestination;
		moveToDestination.parameters.values.push_back(walkSpeed);
		moveToDestination.parameters.values.push_back(1.f);
		moveToDestination.parameters.vectors.push_back({acceptanceRadius, stopOnOverlap ? 1.f : 0.f, usePathfinding ? 1.f : 0.f});
		
		moveToDestination.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, parameterIndex});
		
		return moveToDestination;
	}